

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O3

void __thiscall QDirListingPrivate::beginIterating(QDirListingPrivate *this)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  QAbstractFileEngineIterator *pQVar5;
  pointer *__ptr;
  pointer puVar6;
  pointer this_00;
  
  puVar1 = (this->nativeIterators).
           super__Vector_base<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->nativeIterators).
           super__Vector_base<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = puVar1;
  if (puVar2 != puVar1) {
    do {
      std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>::~unique_ptr
                (this_00);
      this_00 = this_00 + 1;
    } while (this_00 != puVar2);
    (this->nativeIterators).
    super__Vector_base<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  puVar3 = (this->fileEngineIterators).
           super__Vector_base<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->fileEngineIterators).
           super__Vector_base<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar6 = puVar3;
  if (puVar4 != puVar3) {
    do {
      pQVar5 = (puVar6->_M_t).
               super___uniq_ptr_impl<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>
               ._M_t.
               super__Tuple_impl<0UL,_QAbstractFileEngineIterator_*,_std::default_delete<QAbstractFileEngineIterator>_>
               .super__Head_base<0UL,_QAbstractFileEngineIterator_*,_false>._M_head_impl;
      if (pQVar5 != (QAbstractFileEngineIterator *)0x0) {
        (*pQVar5->_vptr_QAbstractFileEngineIterator[1])();
      }
      (puVar6->_M_t).
      super___uniq_ptr_impl<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>
      ._M_t.
      super__Tuple_impl<0UL,_QAbstractFileEngineIterator_*,_std::default_delete<QAbstractFileEngineIterator>_>
      .super__Head_base<0UL,_QAbstractFileEngineIterator_*,_false>._M_head_impl =
           (QAbstractFileEngineIterator *)0x0;
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar4);
    (this->fileEngineIterators).
    super__Vector_base<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar3;
  }
  QDuplicateTracker<QString,_32UL>::clear(&this->visitedLinks);
  pushDirectory(this,&this->initialEntryInfo);
  return;
}

Assistant:

void QDirListingPrivate::beginIterating()
{
#ifndef QT_NO_FILESYSTEMITERATOR
    nativeIterators.clear();
#endif
    fileEngineIterators.clear();
    visitedLinks.clear();
    pushDirectory(initialEntryInfo);
}